

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

MultiplyLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_multiply(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0xe7) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xe7;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.multiply_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::MultiplyLayerParams>
                   (arena);
    (this->layer_).multiply_ = (MultiplyLayerParams *)LVar2;
  }
  return (MultiplyLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyLayerParams* NeuralNetworkLayer::_internal_mutable_multiply() {
  if (!_internal_has_multiply()) {
    clear_layer();
    set_has_multiply();
    layer_.multiply_ = CreateMaybeMessage< ::CoreML::Specification::MultiplyLayerParams >(GetArenaForAllocation());
  }
  return layer_.multiply_;
}